

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::InsertStatement::ToString_abi_cxx11_(string *__return_storage_ptr__,InsertStatement *this)

{
  unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true> *this_00;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_01;
  byte bVar1;
  pointer pOVar2;
  pointer pTVar3;
  const_reference text;
  ExpressionListRef *pEVar4;
  pointer pSVar5;
  type pOVar6;
  pointer pPVar7;
  type this_02;
  reference str;
  reference this_03;
  const_reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  OnConflictAction extraout_DL;
  OnConflictAction extraout_DL_00;
  OnConflictAction extraout_DL_01;
  OnConflictAction action;
  pointer str_00;
  idx_t i;
  ulong uVar10;
  string saved_alias;
  string local_128;
  optional_ptr<duckdb::ExpressionListRef,_true> values_list;
  string local_f0;
  string local_d0;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  CommonTableExpressionMap::ToString_abi_cxx11_(&saved_alias,&this->cte_map);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&saved_alias);
  ::std::__cxx11::string::~string((string *)&saved_alias);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = &this->on_conflict_info;
  bVar1 = 1;
  if ((this->on_conflict_info).
      super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>
      .super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl != (OnConflictInfo *)0x0)
  {
    pOVar2 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->(this_00);
    if (pOVar2->action_type == REPLACE) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar1 = 0;
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->catalog)._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted(&local_128,&this->catalog,'\"',true);
    ::std::operator+(&saved_alias,&local_128,".");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&saved_alias);
    ::std::__cxx11::string::~string((string *)&local_128);
  }
  if ((this->schema)._M_string_length != 0) {
    KeywordHelper::WriteOptionallyQuoted(&local_128,&this->schema,'\"',true);
    ::std::operator+(&saved_alias,&local_128,".");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&saved_alias);
    ::std::__cxx11::string::~string((string *)&local_128);
  }
  KeywordHelper::WriteOptionallyQuoted(&saved_alias,&this->table,'\"',true);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&saved_alias);
  if ((this->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
      _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl != (TableRef *)0x0) {
    pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (&this->table_ref);
    if ((pTVar3->alias)._M_string_length != 0) {
      ::std::__cxx11::string::string(local_b0," AS %s",(allocator *)&local_128);
      pTVar3 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                         (&this->table_ref);
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      KeywordHelper::WriteOptionallyQuoted(&local_d0,&pTVar3->alias,'\"',true);
      StringUtil::Format<std::__cxx11::string>(&saved_alias,(StringUtil *)local_b0,&local_d0,pbVar9)
      ;
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&saved_alias);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string(local_b0);
    }
  }
  if (this->column_order == INSERT_BY_NAME) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->columns).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar10 = 0;
        uVar10 < (ulong)((long)(this->columns).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->columns).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar10 = uVar10 + 1)
    {
      if (uVar10 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      text = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&this->columns,uVar10);
      KeywordHelper::WriteOptionallyQuoted(&saved_alias,text,'\"',true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&saved_alias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  values_list = GetValuesList(this);
  if (values_list.ptr == (ExpressionListRef *)0x0) {
    if ((this->select_statement).
        super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
        .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl ==
        (SelectStatement *)0x0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_006566c4;
    }
    pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(&this->select_statement);
    (*(pSVar5->super_SQLStatement)._vptr_SQLStatement[2])(&saved_alias,pSVar5);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    pEVar4 = optional_ptr<duckdb::ExpressionListRef,_true>::operator->(&values_list);
    ::std::__cxx11::string::string((string *)&saved_alias,(string *)&(pEVar4->super_TableRef).alias)
    ;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    pEVar4 = optional_ptr<duckdb::ExpressionListRef,_true>::operator->(&values_list);
    ::std::__cxx11::string::operator=
              ((string *)&(pEVar4->super_TableRef).alias,(string *)&local_128);
    ::std::__cxx11::string::~string((string *)&local_128);
    pEVar4 = optional_ptr<duckdb::ExpressionListRef,_true>::operator->(&values_list);
    (*(pEVar4->super_TableRef)._vptr_TableRef[2])(&local_128,pEVar4);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_128);
    pEVar4 = optional_ptr<duckdb::ExpressionListRef,_true>::operator->(&values_list);
    ::std::__cxx11::string::_M_assign((string *)&(pEVar4->super_TableRef).alias);
  }
  ::std::__cxx11::string::~string((string *)&saved_alias);
LAB_006566c4:
  if ((bool)(bVar1 & (this_00->
                     super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>
                     .super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl !=
                     (OnConflictInfo *)0x0)) {
    pOVar6 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator*(this_00);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    action = extraout_DL;
    if ((pOVar6->indexed_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pOVar6->indexed_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      str_00 = (pOVar6->indexed_columns).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (str_00 != (pOVar6->indexed_columns).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
        StringUtil::Lower(&saved_alias,str_00);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&saved_alias);
        str_00 = str_00 + 1;
        if (str_00 != (pOVar6->indexed_columns).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      action = extraout_DL_00;
    }
    if ((pOVar6->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(&pOVar6->condition);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_128,pPVar7);
      ::std::operator+(&saved_alias," WHERE ",&local_128);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&saved_alias);
      ::std::__cxx11::string::~string((string *)&local_128);
      action = extraout_DL_01;
    }
    OnConflictActionToString_abi_cxx11_
              (&local_128,(InsertStatement *)(ulong)pOVar6->action_type,action);
    ::std::operator+(&saved_alias," ",&local_128);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&saved_alias);
    ::std::__cxx11::string::~string((string *)&local_128);
    if ((pOVar6->set_info).
        super_unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>._M_t.
        super___uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::UpdateSetInfo_*,_std::default_delete<duckdb::UpdateSetInfo>_>
        .super__Head_base<0UL,_duckdb::UpdateSetInfo_*,_false>._M_head_impl != (UpdateSetInfo *)0x0)
    {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      this_02 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>
                ::operator*(&pOVar6->set_info);
      for (uVar10 = 0;
          uVar10 < (ulong)((long)(this_02->columns).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_02->columns).
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar10 = uVar10 + 1) {
        str = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(&this_02->columns,uVar10);
        this_03 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&this_02->expressions,uVar10);
        if (uVar10 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        StringUtil::Lower(&local_f0,str);
        ::std::operator+(&local_128,&local_f0," = ");
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_03);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar7);
        ::std::operator+(&saved_alias,&local_128,&local_90);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&saved_alias);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::__cxx11::string::~string((string *)&local_f0);
      }
      if ((ParsedExpression *)
          (this_02->condition).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> != (ParsedExpression *)0x0) {
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&this_02->condition);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_128,pPVar7);
        ::std::operator+(&saved_alias," WHERE ",&local_128);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&saved_alias);
        ::std::__cxx11::string::~string((string *)&local_128);
      }
    }
  }
  if ((this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    this_01 = &this->returning_list;
    for (uVar10 = 0;
        uVar10 < (ulong)((long)(this->returning_list).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->returning_list).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      if (uVar10 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_01,uVar10);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar8);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&saved_alias,pPVar7);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_01,uVar10);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar8);
      if ((pPVar7->super_BaseExpression).alias._M_string_length != 0) {
        ::std::__cxx11::string::string(local_50," AS %s",(allocator *)&local_f0);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(this_01,uVar10);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar8);
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        KeywordHelper::WriteOptionallyQuoted
                  (&local_70,&(pPVar7->super_BaseExpression).alias,'\"',true);
        StringUtil::Format<std::__cxx11::string>(&local_128,(StringUtil *)local_50,&local_70,pbVar9)
        ;
        ::std::__cxx11::string::append((string *)&saved_alias);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string(local_50);
      }
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&saved_alias);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string InsertStatement::ToString() const {
	bool or_replace_shorthand_set = false;
	string result;

	result = cte_map.ToString();
	result += "INSERT";
	if (on_conflict_info && on_conflict_info->action_type == OnConflictAction::REPLACE) {
		or_replace_shorthand_set = true;
		result += " OR REPLACE";
	}
	result += " INTO ";
	if (!catalog.empty()) {
		result += KeywordHelper::WriteOptionallyQuoted(catalog) + ".";
	}
	if (!schema.empty()) {
		result += KeywordHelper::WriteOptionallyQuoted(schema) + ".";
	}
	result += KeywordHelper::WriteOptionallyQuoted(table);
	// Write the (optional) alias of the insert target
	if (table_ref && !table_ref->alias.empty()) {
		result += StringUtil::Format(" AS %s", KeywordHelper::WriteOptionallyQuoted(table_ref->alias));
	}
	if (column_order == InsertColumnOrder::INSERT_BY_NAME) {
		result += " BY NAME";
	}
	if (!columns.empty()) {
		result += " (";
		for (idx_t i = 0; i < columns.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			result += KeywordHelper::WriteOptionallyQuoted(columns[i]);
		}
		result += " )";
	}
	result += " ";
	auto values_list = GetValuesList();
	if (values_list) {
		D_ASSERT(!default_values);
		auto saved_alias = values_list->alias;
		values_list->alias = string();
		result += values_list->ToString();
		values_list->alias = saved_alias;
	} else if (select_statement) {
		D_ASSERT(!default_values);
		result += select_statement->ToString();
	} else {
		D_ASSERT(default_values);
		result += "DEFAULT VALUES";
	}
	if (!or_replace_shorthand_set && on_conflict_info) {
		auto &conflict_info = *on_conflict_info;
		result += " ON CONFLICT ";
		// (optional) conflict target
		if (!conflict_info.indexed_columns.empty()) {
			result += "(";
			auto &columns = conflict_info.indexed_columns;
			for (auto it = columns.begin(); it != columns.end();) {
				result += StringUtil::Lower(*it);
				if (++it != columns.end()) {
					result += ", ";
				}
			}
			result += " )";
		}

		// (optional) where clause
		if (conflict_info.condition) {
			result += " WHERE " + conflict_info.condition->ToString();
		}
		result += " " + OnConflictActionToString(conflict_info.action_type);
		if (conflict_info.set_info) {
			D_ASSERT(conflict_info.action_type == OnConflictAction::UPDATE);
			result += " SET ";
			auto &set_info = *conflict_info.set_info;
			D_ASSERT(set_info.columns.size() == set_info.expressions.size());
			// SET <column_name> = <expression>
			for (idx_t i = 0; i < set_info.columns.size(); i++) {
				auto &column = set_info.columns[i];
				auto &expr = set_info.expressions[i];
				if (i) {
					result += ", ";
				}
				result += StringUtil::Lower(column) + " = " + expr->ToString();
			}
			// (optional) where clause
			if (set_info.condition) {
				result += " WHERE " + set_info.condition->ToString();
			}
		}
	}
	if (!returning_list.empty()) {
		result += " RETURNING ";
		for (idx_t i = 0; i < returning_list.size(); i++) {
			if (i > 0) {
				result += ", ";
			}
			auto column = returning_list[i]->ToString();
			if (!returning_list[i]->GetAlias().empty()) {
				column +=
				    StringUtil::Format(" AS %s", KeywordHelper::WriteOptionallyQuoted(returning_list[i]->GetAlias()));
			}
			result += column;
		}
	}
	return result;
}